

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ptr_array.c
# Opt level: O3

int zt_ptr_array_add(zt_ptr_array *array,void *data)

{
  int iVar1;
  
  if (array != (zt_ptr_array *)0x0 && data != (void *)0x0) {
    iVar1 = array->count;
    if (array->size <= iVar1) {
      iVar1 = zt_ptr_array_resize(array,0);
      if (iVar1 < 0) {
        return -1;
      }
      iVar1 = array->count;
    }
    array->array[iVar1] = data;
    array->count = iVar1 + 1;
  }
  return 0;
}

Assistant:

int
zt_ptr_array_add(zt_ptr_array * array, void * data) {
    if (data == NULL || array == NULL) {
        return 0;
    }

    if (zt_ptr_array_is_full(array)) {
        if (zt_ptr_array_resize(array, 0) < 0) {
            return -1;
        }
    }

    array->array[array->count] = data;
    array->count++;

    return 0;
}